

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrHandMeshVertexBufferMSFT *value)

{
  XrResult XVar1;
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  string local_60;
  string local_40;
  
  XVar1 = XR_SUCCESS;
  if ((((int)CONCAT71(in_register_00000009,check_members) != 0) &&
      (XVar1 = XR_SUCCESS, value->vertexCapacityInput != 0)) &&
     (XVar1 = XR_SUCCESS, value->vertices == (XrHandMeshVertexMSFT *)0x0)) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"VUID-XrHandMeshVertexBufferMSFT-vertices-parameter","",
               CONCAT71(in_register_00000009,check_members),
               CONCAT71(in_register_00000081,check_pnext));
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_78,objects_info);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "Structure XrHandMeshVertexBufferMSFT member vertexCapacityInput is NULL, but value->vertexCapacityInput is greater than 0"
               ,"");
    CoreValidLogMessage(instance_info,&local_40,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_78,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_78.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    XVar1 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar1;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrHandMeshVertexBufferMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->vertexCapacityInput is non-zero
    if (0 != value->vertexCapacityInput && nullptr == value->vertices) {
        CoreValidLogMessage(instance_info, "VUID-XrHandMeshVertexBufferMSFT-vertices-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrHandMeshVertexBufferMSFT member vertexCapacityInput is NULL, but value->vertexCapacityInput is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrHandMeshVertexBufferMSFT-vertices-parameter" type
    // Everything checked out properly
    return xr_result;
}